

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  lu_byte lVar1;
  expkind eVar2;
  int iVar3;
  Instruction i;
  
  eVar2 = var->k;
  if (eVar2 == VINDEXED) {
    lVar1 = (var->u).ind.vt;
    iVar3 = luaK_exp2RK(fs,ex);
    i = iVar3 << 0xe |
        (var->u).info << 0x17 | (uint)(var->u).ind.t * 0x40 + (uint)(lVar1 == '\b') * 2 | 8;
  }
  else {
    if (eVar2 != VUPVAL) {
      if (eVar2 == VLOCAL) {
        if (((ex->k == VNONRELOC) && (((uint)(ex->u).info >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (ex->u).info)) {
          fs->freereg = fs->freereg + 0xff;
        }
        exp2reg(fs,ex,(var->u).info);
        return;
      }
      goto LAB_00126909;
    }
    iVar3 = luaK_exp2anyreg(fs,ex);
    i = (var->u).info << 0x17 | iVar3 << 6 | 9;
  }
  luaK_code(fs,i);
LAB_00126909:
  if (((ex->k == VNONRELOC) && (((uint)(ex->u).info >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (ex->u).info)) {
    fs->freereg = fs->freereg + 0xff;
  }
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op = (var->u.ind.vt == VLOCAL) ? OP_SETTABLE : OP_SETTABUP;
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}